

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

bool __thiscall pbrt::BVHAggregate::IntersectP(BVHAggregate *this,Ray *ray,Float tMax)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ulong uVar9;
  bool bVar10;
  LinearBVHNode *pLVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  int nodesToVisit [64];
  undefined8 local_158;
  uint local_150;
  undefined1 local_148 [16];
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_138 [66];
  
  pLVar11 = this->nodes;
  uVar14 = 0;
  if (pLVar11 != (LinearBVHNode *)0x0) {
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar23._4_4_ = uVar4;
    auVar23._0_4_ = uVar2;
    auVar23._8_8_ = 0;
    lVar17 = 0;
    lVar19 = 0;
    lVar22 = 0;
    local_148 = vdivps_avx(auVar25,auVar23);
    fVar29 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_12_ = ZEXT812(0);
    auVar24._12_4_ = 0;
    uVar16 = vcmpps_avx512vl(local_148,auVar24,1);
    auVar23 = vcmpps_avx(local_148,auVar24,1);
    auVar6._8_4_ = 1;
    auVar6._0_8_ = 0x100000001;
    auVar6._12_4_ = 1;
    auVar23 = vandps_avx512vl(auVar23,auVar6);
    uVar18 = 0xc;
    if ((uVar16 & 1) != 0) {
      lVar17 = 0xc;
      uVar18 = uVar14;
    }
    uVar21 = 0xc;
    if ((uVar16 & 2) != 0) {
      lVar19 = 0xc;
      uVar21 = uVar14;
    }
    local_158 = vmovlps_avx(auVar23);
    uVar16 = 0xc;
    if (fVar29 < 0.0) {
      lVar22 = 0xc;
      uVar16 = uVar14;
    }
    uVar20 = 0;
    local_150 = (uint)(fVar29 < 0.0);
    iVar12 = 0;
    do {
      uVar3 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
      uVar5 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
      auVar28._4_4_ = uVar5;
      auVar28._0_4_ = uVar3;
      auVar28._8_8_ = 0;
      fVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
LAB_00413736:
      while( true ) {
        uVar20 = uVar20 + 1;
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar11[iVar12].bounds.pMin.
                                                         super_Tuple3<pbrt::Point3,_float>.x +
                                                 lVar17)),
                                ZEXT416(*(uint *)((long)&pLVar11[iVar12].bounds.pMin.
                                                         super_Tuple3<pbrt::Point3,_float>.y +
                                                 lVar19)),0x10);
        auVar23 = vsubps_avx(auVar23,auVar28);
        auVar27._0_4_ = local_148._0_4_ * auVar23._0_4_;
        auVar27._4_4_ = local_148._4_4_ * auVar23._4_4_;
        auVar27._8_4_ = local_148._8_4_ * auVar23._8_4_;
        auVar27._12_4_ = local_148._12_4_ * auVar23._12_4_;
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar11[iVar12].bounds.pMin.
                                                         super_Tuple3<pbrt::Point3,_float>.x +
                                                 uVar18)),
                                ZEXT416(*(uint *)((long)&pLVar11[iVar12].bounds.pMin.
                                                         super_Tuple3<pbrt::Point3,_float>.y +
                                                 uVar21)),0x10);
        auVar23 = vsubps_avx(auVar23,auVar28);
        auVar26._0_4_ = local_148._0_4_ * auVar23._0_4_ * 1.0000004;
        auVar26._4_4_ = local_148._4_4_ * auVar23._4_4_ * 1.0000004;
        auVar26._8_4_ = local_148._8_4_ * auVar23._8_4_ * 1.0000004;
        auVar26._12_4_ = local_148._12_4_ * auVar23._12_4_ * 1.0000004;
        auVar23 = vshufps_avx(auVar26,auVar26,0xe1);
        uVar9 = vcmpps_avx512vl(auVar23,auVar27,1);
        iVar13 = (int)uVar14;
        if ((uVar9 & 3) == 0) break;
LAB_00413788:
        if (iVar13 == 0) goto LAB_004138e6;
        uVar14 = (ulong)(iVar13 - 1);
        iVar12 = aaStack_138[(long)iVar13 + -1].primitivesOffset;
      }
      auVar23 = vmovshdup_avx(auVar27);
      auVar23 = vmaxss_avx(auVar23,auVar27);
      fVar7 = fVar29 * (*(float *)((long)&pLVar11[iVar12].bounds.pMin.
                                          super_Tuple3<pbrt::Point3,_float>.z + uVar16) - fVar1) *
              1.0000004;
      if (fVar7 < auVar23._0_4_) goto LAB_00413788;
      auVar6 = vmovshdup_avx(auVar26);
      auVar6 = vminss_avx(auVar6,auVar26);
      fVar8 = fVar29 * (*(float *)((long)&pLVar11[iVar12].bounds.pMin.
                                          super_Tuple3<pbrt::Point3,_float>.z + lVar22) - fVar1);
      if (((auVar6._0_4_ < fVar8) ||
          (auVar23 = vmaxss_avx(ZEXT416((uint)fVar8),auVar23), tMax <= auVar23._0_4_)) ||
         (auVar23 = vminss_avx(ZEXT416((uint)fVar7),auVar6), auVar23._0_4_ <= 0.0))
      goto LAB_00413788;
      if (pLVar11[iVar12].nPrimitives == 0) {
        if (*(int *)((long)&local_158 + (ulong)pLVar11[iVar12].axis * 4) == 0) {
          lVar15 = (long)iVar12;
          uVar14 = (ulong)(iVar13 + 1);
          iVar12 = iVar12 + 1;
          aaStack_138[iVar13] = pLVar11[lVar15].field_1;
        }
        else {
          uVar14 = (ulong)(iVar13 + 1);
          aaStack_138[iVar13].primitivesOffset = iVar12 + 1;
          iVar12 = pLVar11[iVar12].field_1.primitivesOffset;
        }
        goto LAB_00413736;
      }
      lVar15 = 0;
      do {
        bVar10 = PrimitiveHandle::IntersectP
                           ((this->primitives).
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            pLVar11[iVar12].field_1.primitivesOffset + lVar15,ray,tMax);
        if (bVar10) {
          uVar14 = 1;
          goto LAB_004138e8;
        }
        lVar15 = lVar15 + 1;
      } while ((uint)lVar15 < (uint)pLVar11[iVar12].nPrimitives);
      if (iVar13 == 0) goto LAB_004138e6;
      uVar14 = (ulong)(iVar13 - 1);
      iVar12 = aaStack_138[(long)iVar13 + -1].primitivesOffset;
      pLVar11 = this->nodes;
    } while( true );
  }
LAB_004138f4:
  return SUB81(uVar14,0);
LAB_004138e6:
  uVar14 = 0;
LAB_004138e8:
  *(long *)(in_FS_OFFSET + -0x350) = *(long *)(in_FS_OFFSET + -0x350) + (ulong)uVar20;
  goto LAB_004138f4;
}

Assistant:

bool BVHAggregate::IntersectP(const Ray &ray, Float tMax) const {
    if (nodes == nullptr)
        return false;
    Vector3f invDir(1.f / ray.d.x, 1.f / ray.d.y, 1.f / ray.d.z);
    int dirIsNeg[3] = {static_cast<int>(invDir.x < 0), static_cast<int>(invDir.y < 0),
                       static_cast<int>(invDir.z < 0)};
    int nodesToVisit[64];
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesVisited = 0;

    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            // Process BVH node _node_ for traversal
            if (node->nPrimitives > 0) {
                for (int i = 0; i < node->nPrimitives; ++i) {
                    if (primitives[node->primitivesOffset + i].IntersectP(ray, tMax)) {
                        bvhNodesVisited += nodesVisited;
                        return true;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];
            } else {
                if (dirIsNeg[node->axis] != 0) {
                    /// second child first
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }
    bvhNodesVisited += nodesVisited;
    return false;
}